

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O0

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  long lVar1;
  undefined1 auVar2 [12];
  int iVar3;
  ProgressData *bar_00;
  timediff_t tVar4;
  double dVar5;
  double dVar6;
  curltime cVar7;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  size_t local_258;
  size_t num;
  int barwidth;
  double percent;
  double frac;
  char format [40];
  undefined1 local_208 [8];
  char line [401];
  curl_off_t point;
  curl_off_t total;
  ProgressData *bar;
  OperationConfig *config;
  per_transfer *per;
  curltime now;
  curl_off_t ulnow_local;
  curl_off_t ultotal_local;
  curl_off_t dlnow_local;
  curl_off_t dltotal_local;
  void *clientp_local;
  
  cVar7 = curlx_now();
  lVar1 = *(long *)((long)clientp + 0x10);
  bar_00 = (ProgressData *)((long)clientp + 0x88);
  if (*(long *)((long)clientp + 0xb8) < 0) {
    if ((dltotal == 0) && (ultotal == 0)) {
      point = 0x7fffffffffffffff;
    }
    else {
      point = dltotal + ultotal;
    }
  }
  else if (0x7fffffffffffffff - *(long *)((long)clientp + 0xb8) < dltotal + ultotal) {
    point = 0x7fffffffffffffff;
  }
  else {
    point = dltotal + ultotal + *(long *)((long)clientp + 0xb8);
  }
  if (*(long *)((long)clientp + 0xb8) < 0) {
    if ((dltotal == 0) && (ultotal == 0)) {
      stack0xffffffffffffff90 = 0x7fffffffffffffff;
    }
    else {
      register0x00000000 = dlnow + ulnow;
    }
  }
  else if (0x7fffffffffffffff - *(long *)((long)clientp + 0xb8) < dlnow + ulnow) {
    stack0xffffffffffffff90 = 0x7fffffffffffffff;
  }
  else {
    register0x00000000 = dlnow + ulnow + *(long *)((long)clientp + 0xb8);
  }
  if (bar_00->calls != 0) {
    auVar2 = cVar7._0_12_;
    if (point == 0) {
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar2._0_8_;
      newer_00.tv_usec = auVar2._8_4_;
      older_00._12_4_ = 0;
      older_00._0_12_ = *(undefined1 (*) [12])((long)clientp + 0x98);
      tVar4 = curlx_timediff(newer_00,older_00);
      if (tVar4 < 100) {
        return 0;
      }
      update_width(bar_00);
      fly(bar_00,stack0xffffffffffffff90 != *(long *)((long)clientp + 0x90));
    }
    else {
      if (*(long *)((long)clientp + 0x90) == stack0xffffffffffffff90) {
        return 0;
      }
      newer._12_4_ = 0;
      newer.tv_sec = auVar2._0_8_;
      newer.tv_usec = auVar2._8_4_;
      older._12_4_ = 0;
      older._0_12_ = *(undefined1 (*) [12])((long)clientp + 0x98);
      tVar4 = curlx_timediff(newer,older);
      if ((tVar4 < 100) && (stack0xffffffffffffff90 < point)) {
        return 0;
      }
    }
  }
  bar_00->calls = bar_00->calls + 1;
  update_width(bar_00);
  if ((0 < point) && (stack0xffffffffffffff90 != *(long *)((long)clientp + 0x90))) {
    if (point < stack0xffffffffffffff90) {
      point = stack0xffffffffffffff90;
    }
    dVar5 = (double)stack0xffffffffffffff90;
    iVar3 = *(int *)((long)clientp + 0xa8) + -7;
    dVar6 = (double)iVar3 * (dVar5 / (double)point);
    local_258 = (size_t)dVar6;
    local_258 = local_258 | (long)(dVar6 - 9.223372036854776e+18) & (long)local_258 >> 0x3f;
    if (400 < local_258) {
      local_258 = 400;
    }
    memset(local_208,0x23,local_258);
    local_208[local_258] = 0;
    curl_msnprintf(&frac,0x28,"\r%%-%ds %%5.1f%%%%",iVar3);
    curl_mfprintf((dVar5 / (double)point) * 100.0,*(undefined8 *)((long)clientp + 0xb0),&frac,
                  local_208);
  }
  fflush(*(FILE **)((long)clientp + 0xb0));
  *(long *)((long)clientp + 0x90) = stack0xffffffffffffff90;
  *(time_t *)((long)clientp + 0x98) = cVar7.tv_sec;
  *(ulong *)((long)clientp + 0xa0) = CONCAT44(now.tv_sec._4_4_,cVar7.tv_usec);
  if ((*(ulong *)(lVar1 + 0x4e4) >> 0x1d & 1) != 0) {
    *(ulong *)(lVar1 + 0x4e4) = *(ulong *)(lVar1 + 0x4e4) & 0xffffffffdfffffff;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
  }
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  struct curltime now = curlx_now();
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  struct ProgressData *bar = &per->progressbar;
  curl_off_t total;
  curl_off_t point;

  /* Calculate expected transfer size. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0) {
    if(dltotal || ultotal)
      total = dltotal + ultotal;
    else
      total = CURL_OFF_T_MAX;
  }
  else if((CURL_OFF_T_MAX - bar->initial_size) < (dltotal + ultotal))
    total = CURL_OFF_T_MAX;
  else
    total = dltotal + ultotal + bar->initial_size;

  /* Calculate the current progress. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0) {
    if(dltotal || ultotal)
      point = dlnow + ulnow;
    else
      point = CURL_OFF_T_MAX;
  }
  else if((CURL_OFF_T_MAX - bar->initial_size) < (dlnow + ulnow))
    point = CURL_OFF_T_MAX;
  else
    point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress did not change since last invoke */
        return 0;
      else if((curlx_timediff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we are at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(curlx_timediff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      update_width(bar);
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  update_width(bar);
  if((total > 0) && (point != bar->prev)) {
    char line[MAX_BARLENGTH + 1];
    char format[40];
    double frac;
    double percent;
    int barwidth;
    size_t num;
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (size_t) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    msnprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
    fprintf(bar->out, format, line, percent);
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}